

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool __thiscall dxil_spv::Converter::Impl::emit_samplers(Impl *this,MDNode *samplers,MDNode *refl)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Id IVar7;
  uint32_t uVar8;
  Builder *this_00;
  MDOperand *md;
  MDNode *resource;
  reference pvVar9;
  LoggingCallback p_Var10;
  void *pvVar11;
  unsigned_long *puVar12;
  reference pvVar13;
  MDNode *in_RCX;
  ulong uVar14;
  char *local_31b0;
  bool local_3169;
  value_type *ref_2;
  Id var_id_2;
  Id type_id;
  value_type *ref_1;
  uint32_t heap_offset_1;
  Id var_id_1;
  value_type *ref;
  char buffer_2 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_2;
  uint32_t heap_offset;
  Id var_id;
  char buffer_1 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_1;
  BindlessInfo bindless_info;
  size_type local_10e8;
  int local_10dc;
  char local_10d8 [8];
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  uint32_t local_c0;
  VulkanBinding vulkan_binding;
  D3DBinding d3d_binding;
  undefined1 local_88 [3];
  bool need_resource_remapping;
  int local_root_signature_entry;
  DescriptorTableEntry local_table_entry;
  uint range_size;
  uint bind_register;
  uint bind_space;
  String name;
  uint index;
  ResourceVariableMeta var_meta;
  MDNode *sampler;
  uint i;
  uint num_samplers;
  Builder *builder;
  MDNode *refl_local;
  MDNode *samplers_local;
  Impl *this_local;
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  uVar3 = LLVMBC::MDNode::getNumOperands(samplers);
  for (sampler._0_4_ = 0; (uint)sampler < uVar3; sampler._0_4_ = (uint)sampler + 1) {
    md = LLVMBC::MDNode::getOperand(samplers,(uint)sampler);
    resource = LLVMBC::cast<LLVMBC::MDNode>(md);
    name.field_2._14_2_ = get_resource_variable_meta(this,resource);
    if ((name.field_2._14_2_ & 0x100) != 0) {
      name.field_2._8_4_ = get_constant_metadata<unsigned_int>(resource,0);
      get_resource_name_metadata_abi_cxx11_
                ((String *)&bind_register,(dxil_spv *)resource,refl,in_RCX);
      uVar4 = get_constant_metadata<unsigned_int>(resource,3);
      local_table_entry.offset_in_heap = get_constant_metadata<unsigned_int>(resource,4);
      local_table_entry.num_descriptors_in_range = get_constant_metadata<unsigned_int>(resource,5);
      if (local_table_entry.num_descriptors_in_range != 1) {
        if (local_table_entry.num_descriptors_in_range == 0xffffffff) {
          spv::Builder::addExtension(this_00,"SPV_EXT_descriptor_indexing");
          spv::Builder::addCapability(this_00,CapabilityRuntimeDescriptorArray);
        }
        spv::Builder::addCapability(this_00,CapabilitySampledImageArrayDynamicIndexing);
      }
      memset(local_88,0,0x14);
      uVar14 = (ulong)local_table_entry.offset_in_heap;
      iVar5 = get_local_root_signature_entry
                        (this,Sampler,uVar4,local_table_entry.offset_in_heap,
                         (DescriptorTableEntry *)local_88);
      local_3169 = true;
      if (-1 < iVar5) {
        pvVar9 = std::
                 vector<dxil_spv::LocalRootSignatureEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::LocalRootSignatureEntry>_>
                 ::operator[](&this->local_root_signature,(long)iVar5);
        local_3169 = pvVar9->type == Table;
      }
      in_RCX = (MDNode *)CONCAT71((int7)(uVar14 >> 8),local_3169);
      vulkan_binding.bindless._4_4_ = get_remapping_stage(this->execution_model);
      vulkan_binding.descriptor_type._0_1_ = 0xe;
      local_c0 = local_table_entry.offset_in_heap;
      vulkan_binding.descriptor_set = 0;
      vulkan_binding.binding = 0;
      vulkan_binding.root_constant_index._0_1_ = 0;
      vulkan_binding.bindless.heap_root_offset = 0;
      cb._4_4_ = uVar4;
      if (((local_3169 == false) ||
          (this->resource_mapping_iface == (ResourceRemappingInterface *)0x0)) ||
         (uVar6 = (*this->resource_mapping_iface->_vptr_ResourceRemappingInterface[3])
                            (this->resource_mapping_iface,&vulkan_binding.bindless.use_heap,
                             (long)&cb + 4), (uVar6 & 1) != 0)) {
        local_10e8 = std::
                     vector<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                     ::size(&this->sampler_index_to_reference);
        bindless_info._28_8_ = ZEXT48(name.field_2._8_4_ + 1);
        puVar12 = std::max<unsigned_long>(&local_10e8,(unsigned_long *)&bindless_info.desc_set);
        std::
        vector<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
        ::resize(&this->sampler_index_to_reference,*puVar12);
        memset((void *)((long)&cb_1 + 4),0,0x24);
        cb_1._4_1_ = 3;
        bindless_info.type = 0xe;
        bindless_info.uav_read = (bool)cb._4_1_;
        bindless_info.uav_written = (bool)cb._5_1_;
        bindless_info.uav_coherent = (bool)cb._6_1_;
        bindless_info.counters = (bool)cb._7_1_;
        bindless_info.offsets = (bool)(undefined1)local_c0;
        bindless_info.aliased = (bool)local_c0._1_1_;
        bindless_info.relaxed_precision = (bool)local_c0._2_1_;
        bindless_info._27_1_ = local_c0._3_1_;
        if (iVar5 < 0) {
          if (((byte)vulkan_binding.root_constant_index & 1) == 0) {
            ref_2._4_4_ = spv::Builder::makeSamplerType(this_00);
            if (local_table_entry.num_descriptors_in_range != 1) {
              if (local_table_entry.num_descriptors_in_range == 0xffffffff) {
                ref_2._4_4_ = spv::Builder::makeRuntimeArray(this_00,ref_2._4_4_);
              }
              else {
                IVar7 = spv::Builder::makeUintConstant
                                  (this_00,local_table_entry.num_descriptors_in_range,false);
                ref_2._4_4_ = spv::Builder::makeArrayType(this_00,ref_2._4_4_,IVar7,0);
              }
            }
            bVar2 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    ::empty((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                             *)&bind_register);
            if (bVar2) {
              local_31b0 = (char *)0x0;
            }
            else {
              local_31b0 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                           ::c_str((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                                    *)&bind_register);
            }
            IVar7 = create_variable(this,StorageClassUniformConstant,ref_2._4_4_,local_31b0);
            spv::Builder::addDecoration(this_00,IVar7,DecorationDescriptorSet,cb._4_4_);
            spv::Builder::addDecoration(this_00,IVar7,DecorationBinding,local_c0);
            pvVar13 = std::
                      vector<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                      ::operator[](&this->sampler_index_to_reference,(ulong)(uint)name.field_2._8_4_
                                  );
            pvVar13->var_id = IVar7;
            uVar4 = CONCAT31((int3)(IVar7 >> 8),local_table_entry.num_descriptors_in_range != 1);
            pvVar13->base_resource_is_array = local_table_entry.num_descriptors_in_range != 1;
            pvVar13->resource_kind = Sampler;
          }
          else {
            IVar7 = create_bindless_heap_variable(this,(BindlessInfo *)((long)&cb_1 + 4));
            ref_1._0_4_ = vulkan_binding.binding;
            if ((local_table_entry.num_descriptors_in_range != 1) &&
               ((name.field_2._14_2_ & 1) == 0)) {
              ref_1._0_4_ = vulkan_binding.binding - local_table_entry.offset_in_heap;
            }
            pvVar13 = std::
                      vector<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                      ::operator[](&this->sampler_index_to_reference,(ulong)(uint)name.field_2._8_4_
                                  );
            pvVar13->var_id = IVar7;
            pvVar13->push_constant_member =
                 vulkan_binding.descriptor_set + this->root_descriptor_count;
            pvVar13->base_offset = (uint32_t)ref_1;
            pvVar13->bindless = true;
            uVar4 = CONCAT31((int3)((uint32_t)ref_1 >> 8),
                             local_table_entry.num_descriptors_in_range != 1);
            pvVar13->base_resource_is_array = local_table_entry.num_descriptors_in_range != 1;
            pvVar13->resource_kind = Sampler;
          }
LAB_0013d530:
          in_RCX = (MDNode *)(ulong)uVar4;
          local_10dc = 0;
        }
        else if (((byte)vulkan_binding.root_constant_index & 1) == 0) {
          p_Var10 = get_thread_log_callback();
          if (p_Var10 == (LoggingCallback)0x0) {
            fprintf(_stderr,"[ERROR]: Table SBT entries must be bindless.\n");
            fflush(_stderr);
          }
          else {
            snprintf((char *)&heap_offset,0x1000,"Table SBT entries must be bindless.\n");
            pvVar11 = get_thread_log_callback_userdata();
            (*p_Var10)(pvVar11,Error,(char *)&heap_offset);
          }
          this_local._7_1_ = 0;
          local_10dc = 1;
        }
        else {
          IVar7 = create_bindless_heap_variable(this,(BindlessInfo *)((long)&cb_1 + 4));
          uVar8 = (local_table_entry.offset_in_heap - local_table_entry.type) +
                  local_table_entry.register_index;
          if ((name.field_2._14_2_ & 1) != 0) {
            pvVar13 = std::
                      vector<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                      ::operator[](&this->sampler_index_to_reference,(ulong)(uint)name.field_2._8_4_
                                  );
            pvVar13->var_id = IVar7;
            pvVar13->base_offset = uVar8;
            pvVar13->bindless = true;
            pvVar13->local_root_signature_entry = iVar5;
            uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),
                             local_table_entry.num_descriptors_in_range != 1);
            pvVar13->base_resource_is_array = local_table_entry.num_descriptors_in_range != 1;
            pvVar13->resource_kind = Sampler;
            goto LAB_0013d530;
          }
          buffer_2._4088_8_ = get_thread_log_callback();
          if ((LoggingCallback)buffer_2._4088_8_ == (LoggingCallback)0x0) {
            fprintf(_stderr,"[ERROR]: Local root signature requires global lib variables.\n");
            fflush(_stderr);
          }
          else {
            snprintf((char *)&ref,0x1000,"Local root signature requires global lib variables.\n");
            uVar1 = buffer_2._4088_8_;
            pvVar11 = get_thread_log_callback_userdata();
            (*(code *)uVar1)(pvVar11,2,&ref);
          }
          this_local._7_1_ = 0;
          local_10dc = 1;
        }
      }
      else {
        p_Var10 = get_thread_log_callback();
        if (p_Var10 == (LoggingCallback)0x0) {
          in_RCX = (MDNode *)(ulong)local_table_entry.offset_in_heap;
          fprintf(_stderr,"[ERROR]: Failed to remap sampler %u:%u.\n",(ulong)uVar4);
          fflush(_stderr);
        }
        else {
          in_RCX = (MDNode *)(ulong)uVar4;
          snprintf(local_10d8,0x1000,"Failed to remap sampler %u:%u.\n",in_RCX,
                   (ulong)local_table_entry.offset_in_heap);
          pvVar11 = get_thread_log_callback_userdata();
          (*p_Var10)(pvVar11,Error,local_10d8);
        }
        this_local._7_1_ = 0;
        local_10dc = 1;
      }
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                     *)&bind_register);
      if (local_10dc != 0) goto LAB_0013d565;
    }
  }
  this_local._7_1_ = 1;
LAB_0013d565:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Converter::Impl::emit_samplers(const llvm::MDNode *samplers, const llvm::MDNode *refl)
{
	auto &builder = spirv_module.get_builder();
	unsigned num_samplers = samplers->getNumOperands();

	for (unsigned i = 0; i < num_samplers; i++)
	{
		auto *sampler = llvm::cast<llvm::MDNode>(samplers->getOperand(i));

		auto var_meta = get_resource_variable_meta(sampler);
		if (!var_meta.is_active)
			continue;

		unsigned index = get_constant_metadata(sampler, 0);
		auto name = get_resource_name_metadata(sampler, refl);
		unsigned bind_space = get_constant_metadata(sampler, 3);
		unsigned bind_register = get_constant_metadata(sampler, 4);
		unsigned range_size = get_constant_metadata(sampler, 5);

		if (range_size != 1)
		{
			if (range_size == ~0u)
			{
				builder.addExtension("SPV_EXT_descriptor_indexing");
				builder.addCapability(spv::CapabilityRuntimeDescriptorArrayEXT);
			}

			// This capability also covers samplers.
			builder.addCapability(spv::CapabilitySampledImageArrayDynamicIndexing);
		}

		DescriptorTableEntry local_table_entry = {};
		int local_root_signature_entry = get_local_root_signature_entry(
			ResourceClass::Sampler, bind_space, bind_register, local_table_entry);
		bool need_resource_remapping = local_root_signature_entry < 0 ||
		                               local_root_signature[local_root_signature_entry].type == LocalRootSignatureType::Table;

		D3DBinding d3d_binding = { get_remapping_stage(execution_model),
			                       DXIL::ResourceKind::Sampler,
			                       index,
			                       bind_space,
			                       bind_register,
			                       range_size, 0 };
		VulkanBinding vulkan_binding = { bind_space, bind_register };
		if (need_resource_remapping && resource_mapping_iface && !resource_mapping_iface->remap_sampler(d3d_binding, vulkan_binding))
		{
			LOGE("Failed to remap sampler %u:%u.\n", bind_space, bind_register);
			return false;
		}

		sampler_index_to_reference.resize(std::max(sampler_index_to_reference.size(), size_t(index + 1)));

		BindlessInfo bindless_info = {};
		bindless_info.type = DXIL::ResourceType::Sampler;
		bindless_info.kind = DXIL::ResourceKind::Sampler;
		bindless_info.desc_set = vulkan_binding.descriptor_set;
		bindless_info.binding = vulkan_binding.binding;

		if (local_root_signature_entry >= 0)
		{
			// Samplers can only live in table entries.
			if (!vulkan_binding.bindless.use_heap)
			{
				LOGE("Table SBT entries must be bindless.\n");
				return false;
			}

			spv::Id var_id = create_bindless_heap_variable(bindless_info);

			uint32_t heap_offset = local_table_entry.offset_in_heap;
			heap_offset += bind_register - local_table_entry.register_index;

			if (!var_meta.is_lib_variable)
			{
				LOGE("Local root signature requires global lib variables.\n");
				return false;
			}

			auto &ref = sampler_index_to_reference[index];
			ref.var_id = var_id;
			ref.base_offset = heap_offset;
			ref.bindless = true;
			ref.local_root_signature_entry = local_root_signature_entry;
			ref.base_resource_is_array = range_size != 1;
			ref.resource_kind = DXIL::ResourceKind::Sampler;
		}
		else if (vulkan_binding.bindless.use_heap)
		{
			spv::Id var_id = create_bindless_heap_variable(bindless_info);

			// DXIL already applies the t# register offset to any dynamic index, so counteract that here.
			// The exception is with lib_* where we access resources by variable, not through
			// createResource() >_____<.
			uint32_t heap_offset = vulkan_binding.bindless.heap_root_offset;
			if (range_size != 1 && !var_meta.is_lib_variable)
				heap_offset -= bind_register;

			auto &ref = sampler_index_to_reference[index];
			ref.var_id = var_id;
			ref.push_constant_member = vulkan_binding.root_constant_index + root_descriptor_count;
			ref.base_offset = heap_offset;
			ref.bindless = true;
			ref.base_resource_is_array = range_size != 1;
			ref.resource_kind = DXIL::ResourceKind::Sampler;
		}
		else
		{
			spv::Id type_id = builder.makeSamplerType();

			if (range_size != 1)
			{
				if (range_size == ~0u)
					type_id = builder.makeRuntimeArray(type_id);
				else
					type_id = builder.makeArrayType(type_id, builder.makeUintConstant(range_size), 0);
			}

			spv::Id var_id = create_variable(spv::StorageClassUniformConstant, type_id, name.empty() ? nullptr : name.c_str());

			builder.addDecoration(var_id, spv::DecorationDescriptorSet, vulkan_binding.descriptor_set);
			builder.addDecoration(var_id, spv::DecorationBinding, vulkan_binding.binding);

			auto &ref = sampler_index_to_reference[index];
			ref.var_id = var_id;
			ref.base_resource_is_array = range_size != 1;
			ref.resource_kind = DXIL::ResourceKind::Sampler;
		}
	}

	return true;
}